

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void fprint_stone_identifier(FILE *out,event_path_data evp,int stone_num)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (stone_num < 0) {
    uVar1 = lookup_local_stone(evp,stone_num);
    uVar3 = (ulong)uVar1;
  }
  else {
    uVar3 = 0;
    uVar2 = (ulong)(uint)evp->stone_lookup_table_size;
    if (evp->stone_lookup_table_size < 1) {
      uVar2 = uVar3;
    }
    do {
      uVar4 = uVar3;
      if (uVar2 == uVar4) {
        uVar3 = (ulong)(uint)stone_num;
        stone_num = 0xffffffff;
        goto LAB_0012d56b;
      }
      uVar3 = uVar4 + 1;
    } while (evp->stone_lookup_table[uVar4].local_id != stone_num);
    uVar3 = (ulong)(uint)stone_num;
    stone_num = evp->stone_lookup_table[uVar4].global_id;
  }
LAB_0012d56b:
  fprintf((FILE *)out,"local stone number %x",uVar3);
  if (stone_num == 0xffffffff) {
    return;
  }
  fprintf((FILE *)out," (global %x)",(ulong)(uint)stone_num);
  return;
}

Assistant:

static void
fprint_stone_identifier(FILE *out, event_path_data evp, int stone_num)
{
    int local_stone_num = -1;
    int global_stone_num = -1;
    if ((stone_num & 0x80000000) == 0x80000000) {
	local_stone_num = lookup_local_stone(evp, stone_num);
	global_stone_num = stone_num;
    } else {
	int i;
	local_stone_num = stone_num;
	for (i=0; i < evp->stone_lookup_table_size; i++) {
	    if (evp->stone_lookup_table[i].local_id == stone_num) {
		global_stone_num = evp->stone_lookup_table[i].global_id;
		break;
	    }
	}
    }
    fprintf(out, "local stone number %x", local_stone_num);
    if (global_stone_num != -1) {
	fprintf(out, " (global %x)", global_stone_num);
    }
}